

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O1

int read_line_header_format_entries
              (backtrace_state *state,dwarf_data *ddata,unit *u,dwarf_buf *hdr_buf,line_header *hdr,
              size_t *pcount,char ***ppaths)

{
  byte *pbVar1;
  char *__s;
  byte bVar2;
  int iVar3;
  void *pvVar4;
  uint64_t uVar5;
  size_t sVar6;
  char *__dest;
  char **ppcVar7;
  uint uVar8;
  ulong uVar9;
  uint64_t uVar10;
  bool bVar11;
  char local_188 [8];
  char b [200];
  ulong local_b8;
  char *local_88;
  char *path;
  dwarf_sections *local_78;
  uint64_t *local_70;
  dwarf_data *local_68;
  void *local_60;
  size_t local_58;
  char **local_50;
  char *local_48;
  backtrace_state *local_40;
  uint64_t local_38;
  
  pbVar1 = hdr_buf->buf;
  path = (char *)u;
  local_70 = pcount;
  local_68 = ddata;
  local_40 = state;
  iVar3 = advance(hdr_buf,1);
  if (iVar3 == 0) {
    bVar2 = 0;
  }
  else {
    bVar2 = *pbVar1;
  }
  uVar8 = (uint)bVar2;
  if (bVar2 == 0) {
    pvVar4 = (void *)0x0;
  }
  else {
    pvVar4 = tcmalloc_backtrace_alloc
                       (local_40,(ulong)(uVar8 * 8),hdr_buf->error_callback,hdr_buf->data);
    if (pvVar4 == (void *)0x0) {
      return 0;
    }
    uVar9 = 0;
    do {
      uVar5 = read_uleb128(hdr_buf);
      *(int *)((long)pvVar4 + uVar9 * 8) = (int)uVar5;
      uVar5 = read_uleb128(hdr_buf);
      *(int *)((long)pvVar4 + uVar9 * 8 + 4) = (int)uVar5;
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  uVar5 = read_uleb128(hdr_buf);
  if (uVar5 == 0) {
    ppcVar7 = (char **)0x0;
    *local_70 = 0;
  }
  else {
    local_50 = (char **)tcmalloc_backtrace_alloc
                                  (local_40,uVar5 * 8,hdr_buf->error_callback,hdr_buf->data);
    if (local_50 == (char **)0x0) {
      iVar3 = 0;
      goto LAB_0012d2ee;
    }
    local_78 = &local_68->dwarf_sections;
    uVar10 = 0;
    local_60 = pvVar4;
    do {
      local_88 = (char *)0x0;
      local_38 = uVar10;
      if (bVar2 == 0) {
        local_48 = (char *)0x0;
      }
      else {
        uVar9 = 0;
        local_48 = (char *)0x0;
        do {
          pvVar4 = local_60;
          bVar11 = false;
          iVar3 = read_attribute(*(dwarf_form *)((long)local_60 + uVar9 * 8 + 4),0,hdr_buf,
                                 *(int *)(path + 0x2c),*(int *)(path + 0x28),hdr->addrsize,local_78,
                                 local_68->altlink,(attr_val *)(b + 0xc0));
          uVar10 = local_38;
          if (iVar3 != 0) {
            iVar3 = *(int *)((long)pvVar4 + uVar9 * 8);
            bVar11 = true;
            if (iVar3 == 2) {
              if (b._192_4_ == 3) {
                if (local_b8 < hdr->dirs_count) {
                  local_48 = hdr->dirs[local_b8];
                }
                else {
                  bVar11 = false;
                  snprintf(local_188,200,"%s in %s at %d",
                           "invalid directory index in line number program header",hdr_buf->name,
                           (ulong)(uint)(*(int *)&hdr_buf->buf - *(int *)&hdr_buf->start));
                  (*hdr_buf->error_callback)(hdr_buf->data,local_188,0);
                }
              }
            }
            else if (iVar3 == 1) {
              iVar3 = resolve_string(local_78,*(int *)(path + 0x2c),local_68->is_bigendian,
                                     *(uint64_t *)(path + 0x40),(attr_val *)(b + 0xc0),
                                     hdr_buf->error_callback,hdr_buf->data,&local_88);
              bVar11 = iVar3 != 0;
              uVar10 = local_38;
            }
          }
          if (!bVar11) goto LAB_0012d2cb;
          uVar9 = uVar9 + 1;
        } while (uVar8 != uVar9);
      }
      __s = local_88;
      if (local_88 == (char *)0x0) {
        snprintf(local_188,200,"%s in %s at %d","missing file name in line number program header",
                 hdr_buf->name,(ulong)(uint)(*(int *)&hdr_buf->buf - *(int *)&hdr_buf->start));
        (*hdr_buf->error_callback)(hdr_buf->data,local_188,0);
LAB_0012d2cb:
        tcmalloc_backtrace_free(local_40,local_50,uVar5 * 8,hdr_buf->error_callback,hdr_buf->data);
        iVar3 = 0;
        pvVar4 = local_60;
        goto LAB_0012d2ee;
      }
      __dest = local_88;
      if (local_48 != (char *)0x0) {
        local_58 = strlen(local_48);
        sVar6 = strlen(__s);
        __dest = (char *)tcmalloc_backtrace_alloc
                                   (local_40,local_58 + sVar6 + 2,hdr_buf->error_callback,
                                    hdr_buf->data);
        if (__dest == (char *)0x0) goto LAB_0012d2cb;
        memcpy(__dest,local_48,local_58);
        __dest[local_58] = '/';
        memcpy(__dest + local_58 + 1,__s,sVar6 + 1);
      }
      local_50[uVar10] = __dest;
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar5);
    *local_70 = uVar5;
    ppcVar7 = local_50;
    pvVar4 = local_60;
  }
  *ppaths = ppcVar7;
  iVar3 = 1;
LAB_0012d2ee:
  if (pvVar4 != (void *)0x0) {
    tcmalloc_backtrace_free
              (local_40,pvVar4,(ulong)(uVar8 * 8),hdr_buf->error_callback,hdr_buf->data);
  }
  return iVar3;
}

Assistant:

static int
read_line_header_format_entries (struct backtrace_state *state,
				 struct dwarf_data *ddata,
				 struct unit *u,
				 struct dwarf_buf *hdr_buf,
				 struct line_header *hdr,
				 size_t *pcount,
				 const char ***ppaths)
{
  size_t formats_count;
  struct line_header_format *formats;
  size_t paths_count;
  const char **paths;
  size_t i;
  int ret;

  formats_count = read_byte (hdr_buf);
  if (formats_count == 0)
    formats = NULL;
  else
    {
      formats = ((struct line_header_format *)
		 backtrace_alloc (state,
				  (formats_count
				   * sizeof (struct line_header_format)),
				  hdr_buf->error_callback,
				  hdr_buf->data));
      if (formats == NULL)
	return 0;

      for (i = 0; i < formats_count; i++)
	{
	  formats[i].lnct = (int) read_uleb128(hdr_buf);
	  formats[i].form = (enum dwarf_form) read_uleb128 (hdr_buf);
	}
    }

  paths_count = read_uleb128 (hdr_buf);
  if (paths_count == 0)
    {
      *pcount = 0;
      *ppaths = NULL;
      ret = 1;
      goto exit;
    }

  paths = ((const char **)
	   backtrace_alloc (state, paths_count * sizeof (const char *),
			    hdr_buf->error_callback, hdr_buf->data));
  if (paths == NULL)
    {
      ret = 0;
      goto exit;
    }
  for (i = 0; i < paths_count; i++)
    {
      if (!read_lnct (state, ddata, u, hdr_buf, hdr, formats_count,
		      formats, &paths[i]))
	{
	  backtrace_free (state, paths,
			  paths_count * sizeof (const char *),
			  hdr_buf->error_callback, hdr_buf->data);
	  ret = 0;
	  goto exit;
	}
    }

  *pcount = paths_count;
  *ppaths = paths;

  ret = 1;

 exit:
  if (formats != NULL)
    backtrace_free (state, formats,
		    formats_count * sizeof (struct line_header_format),
		    hdr_buf->error_callback, hdr_buf->data);

  return  ret;
}